

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>::
emplaceRealloc<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
          (SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter> *this,
          pointer pos,TypeSetter *args)

{
  ulong uVar1;
  size_type sVar2;
  undefined8 *puVar3;
  Expression *pEVar4;
  pointer pTVar5;
  pointer pTVar6;
  TypeSetter *__cur;
  pointer pTVar7;
  EVP_PKEY_CTX *ctx;
  long lVar8;
  ulong capacity;
  
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = this->len + 1;
  uVar1 = this->cap;
  if (capacity < uVar1 * 2) {
    capacity = uVar1 * 2;
  }
  if (0x7fffffffffffffff - uVar1 < uVar1) {
    capacity = 0x7fffffffffffffff;
  }
  lVar8 = (long)pos - (long)this->data_;
  ctx = (EVP_PKEY_CTX *)0x10;
  pTVar5 = (pointer)detail::allocArray(capacity,0x10);
  pEVar4 = (args->expr).ptr;
  *(undefined8 *)((long)pTVar5 + lVar8) = (args->type).ptr;
  ((undefined8 *)((long)pTVar5 + lVar8))[1] = pEVar4;
  pTVar6 = this->data_;
  pTVar7 = pTVar5;
  if (pTVar6 + this->len == pos) {
    for (; pTVar6 != pos; pTVar6 = pTVar6 + 1) {
      pEVar4 = (pTVar6->expr).ptr;
      (pTVar7->type).ptr = (pTVar6->type).ptr;
      (pTVar7->expr).ptr = pEVar4;
      pTVar7 = pTVar7 + 1;
    }
  }
  else {
    for (; pTVar6 != pos; pTVar6 = pTVar6 + 1) {
      pEVar4 = (pTVar6->expr).ptr;
      (pTVar7->type).ptr = (pTVar6->type).ptr;
      (pTVar7->expr).ptr = pEVar4;
      pTVar7 = pTVar7 + 1;
    }
    sVar2 = this->len;
    pTVar6 = this->data_;
    puVar3 = (undefined8 *)((long)pTVar5 + lVar8);
    for (; pos != pTVar6 + sVar2; pos = pos + 1) {
      pEVar4 = (pos->expr).ptr;
      puVar3[2] = (pos->type).ptr;
      puVar3[3] = pEVar4;
      puVar3 = puVar3 + 2;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = pTVar5;
  return (pointer)((long)pTVar5 + lVar8);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}